

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

OnCallSpec<ot::commissioner::Error_(unsigned_short_&,_ot::commissioner::JoinerType)> * __thiscall
testing::internal::
FunctionMocker<ot::commissioner::Error_(unsigned_short_&,_ot::commissioner::JoinerType)>::
FindOnCallSpec(FunctionMocker<ot::commissioner::Error_(unsigned_short_&,_ot::commissioner::JoinerType)>
               *this,ArgumentTuple *args)

{
  OnCallSpec<ot::commissioner::Error_(unsigned_short_&,_ot::commissioner::JoinerType)> *this_00;
  bool bVar1;
  reference ppvVar2;
  OnCallSpec<ot::commissioner::Error_(unsigned_short_&,_ot::commissioner::JoinerType)> *spec;
  const_reverse_iterator it;
  ArgumentTuple *args_local;
  FunctionMocker<ot::commissioner::Error_(unsigned_short_&,_ot::commissioner::JoinerType)>
  *this_local;
  
  it.current._M_current =
       (__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
        )(__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
          )args;
  std::vector<const_void_*,_std::allocator<const_void_*>_>::rbegin
            ((vector<const_void_*,_std::allocator<const_void_*>_> *)&stack0xffffffffffffffd8);
  while( true ) {
    std::vector<const_void_*,_std::allocator<const_void_*>_>::rend
              ((vector<const_void_*,_std::allocator<const_void_*>_> *)&spec);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
                             *)&stack0xffffffffffffffd8,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
                             *)&spec);
    if (!bVar1) {
      return (OnCallSpec<ot::commissioner::Error_(unsigned_short_&,_ot::commissioner::JoinerType)> *
             )0x0;
    }
    ppvVar2 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
                           *)&stack0xffffffffffffffd8);
    this_00 = (OnCallSpec<ot::commissioner::Error_(unsigned_short_&,_ot::commissioner::JoinerType)>
               *)*ppvVar2;
    bVar1 = OnCallSpec<ot::commissioner::Error_(unsigned_short_&,_ot::commissioner::JoinerType)>::
            Matches(this_00,(ArgumentTuple *)it.current._M_current);
    if (bVar1) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
                  *)&stack0xffffffffffffffd8);
  }
  return this_00;
}

Assistant:

const OnCallSpec<F>* FindOnCallSpec(
      const ArgumentTuple& args) const {
    for (UntypedOnCallSpecs::const_reverse_iterator it
             = untyped_on_call_specs_.rbegin();
         it != untyped_on_call_specs_.rend(); ++it) {
      const OnCallSpec<F>* spec = static_cast<const OnCallSpec<F>*>(*it);
      if (spec->Matches(args))
        return spec;
    }

    return nullptr;
  }